

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
ChainstateManager::ProcessNewBlockHeaders
          (ChainstateManager *this,span<const_CBlockHeader,_18446744073709551615UL> headers,
          bool min_pow_checked,BlockValidationState *state,CBlockIndex **ppindex)

{
  CBlockIndex *pCVar1;
  string_view source_file;
  bool bVar2;
  long lVar3;
  time_point tVar4;
  long lVar5;
  Logger *pLVar6;
  long lVar7;
  CBlockHeader *block;
  double *args_1;
  CBlockHeader *header;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  double progress;
  CBlockIndex *pindex;
  char *pcStack_70;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock33;
  undefined1 local_48;
  undefined8 local_38;
  
  block = headers._M_ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  args_1 = (double *)0x1128;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock33,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
             ,0x1128,false);
  lVar3 = headers._M_extent._M_extent_value._M_extent_value * 0x50;
  do {
    if (lVar3 == 0) {
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock33.super_unique_lock);
      bVar2 = NotifyHeaderTip(this);
      if (bVar2) {
        bVar2 = IsInitialBlockDownload(this);
        if ((ppindex != (CBlockIndex **)0x0 && bVar2) &&
           (pCVar1 = *ppindex, pCVar1 != (CBlockIndex *)0x0)) {
          tVar4 = NodeClock::now();
          lVar5 = (long)((long)tVar4.__d.__r + (ulong)pCVar1->nTime * -1000000000) /
                  ((((this->m_options).chainparams)->consensus).nPowTargetSpacing * 1000000000);
          lVar7 = 0;
          if (0 < lVar5) {
            lVar7 = lVar5;
          }
          progress = ((double)pCVar1->nHeight * 100.0) / (double)(lVar7 + pCVar1->nHeight);
          pLVar6 = LogInstance();
          bVar2 = BCLog::Logger::Enabled(pLVar6);
          if (bVar2) {
            criticalblock33.super_unique_lock._M_device = (mutex_type *)&stack0xffffffffffffffb8;
            criticalblock33.super_unique_lock._M_owns = false;
            criticalblock33.super_unique_lock._9_7_ = 0;
            local_48 = '\0';
            tinyformat::format<int,double>
                      ((string *)&pindex,
                       (tinyformat *)"Synchronizing blockheaders, height: %d (~%.2f%%)\n",
                       (char *)&pCVar1->nHeight,(int *)&progress,args_1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &criticalblock33,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pindex);
            std::__cxx11::string::~string((string *)&pindex);
            pLVar6 = LogInstance();
            pindex = (CBlockIndex *)0x57;
            pcStack_70 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
            ;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
            ;
            source_file._M_len = 0x57;
            str._M_str = (char *)criticalblock33.super_unique_lock._M_device;
            str._M_len = criticalblock33.super_unique_lock._8_8_;
            logging_function._M_str = "ProcessNewBlockHeaders";
            logging_function._M_len = 0x16;
            BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,0x113c,ALL,Info);
            std::__cxx11::string::~string((string *)&criticalblock33);
          }
        }
      }
LAB_0036c7ac:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return lVar3 == 0;
      }
      __stack_chk_fail();
    }
    pindex = (CBlockIndex *)0x0;
    args_1 = (double *)(ulong)min_pow_checked;
    bVar2 = AcceptBlockHeader(this,block,state,&pindex,min_pow_checked);
    CheckBlockIndex(this);
    if (!bVar2) {
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock33.super_unique_lock);
      goto LAB_0036c7ac;
    }
    if (ppindex != (CBlockIndex **)0x0) {
      *ppindex = pindex;
    }
    block = block + 1;
    lVar3 = lVar3 + -0x50;
  } while( true );
}

Assistant:

bool ChainstateManager::ProcessNewBlockHeaders(std::span<const CBlockHeader> headers, bool min_pow_checked, BlockValidationState& state, const CBlockIndex** ppindex)
{
    AssertLockNotHeld(cs_main);
    {
        LOCK(cs_main);
        for (const CBlockHeader& header : headers) {
            CBlockIndex *pindex = nullptr; // Use a temp pindex instead of ppindex to avoid a const_cast
            bool accepted{AcceptBlockHeader(header, state, &pindex, min_pow_checked)};
            CheckBlockIndex();

            if (!accepted) {
                return false;
            }
            if (ppindex) {
                *ppindex = pindex;
            }
        }
    }
    if (NotifyHeaderTip()) {
        if (IsInitialBlockDownload() && ppindex && *ppindex) {
            const CBlockIndex& last_accepted{**ppindex};
            int64_t blocks_left{(NodeClock::now() - last_accepted.Time()) / GetConsensus().PowTargetSpacing()};
            blocks_left = std::max<int64_t>(0, blocks_left);
            const double progress{100.0 * last_accepted.nHeight / (last_accepted.nHeight + blocks_left)};
            LogInfo("Synchronizing blockheaders, height: %d (~%.2f%%)\n", last_accepted.nHeight, progress);
        }
    }
    return true;
}